

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Snapshot * __thiscall leveldb::DBImpl::GetSnapshot(DBImpl *this)

{
  long lVar1;
  SnapshotImpl *pSVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->mutex_).mu_);
  pSVar2 = SnapshotList::New(&this->snapshots_,this->versions_->last_sequence_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return &pSVar2->super_Snapshot;
  }
  __stack_chk_fail();
}

Assistant:

const Snapshot* DBImpl::GetSnapshot() {
  MutexLock l(&mutex_);
  return snapshots_.New(versions_->LastSequence());
}